

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_rfc6979_hmac_sha256_initialize
               (secp256k1_rfc6979_hmac_sha256 *rng,uchar *key,size_t keylen)

{
  void *in_RDI;
  secp256k1_hmac_sha256 hmac;
  uchar *in_stack_ffffffffffffff18;
  secp256k1_hmac_sha256 *in_stack_ffffffffffffff20;
  uchar *in_stack_ffffffffffffff38;
  secp256k1_hmac_sha256 *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffffd0;
  uchar *in_stack_ffffffffffffffd8;
  secp256k1_hmac_sha256 *in_stack_ffffffffffffffe0;
  
  memset(in_RDI,1,0x20);
  memset((void *)((long)in_RDI + 0x20),0,0x20);
  secp256k1_hmac_sha256_initialize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  secp256k1_hmac_sha256_write(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0x1123bc);
  secp256k1_hmac_sha256_write(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0x1123d0);
  secp256k1_hmac_sha256_write(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0x1123e8);
  secp256k1_hmac_sha256_finalize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  secp256k1_hmac_sha256_initialize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  secp256k1_hmac_sha256_write(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0x11242a);
  secp256k1_hmac_sha256_finalize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  secp256k1_hmac_sha256_initialize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  secp256k1_hmac_sha256_write(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0x112468);
  secp256k1_hmac_sha256_write(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0x11247c);
  secp256k1_hmac_sha256_write(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0x112494);
  secp256k1_hmac_sha256_finalize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  secp256k1_hmac_sha256_initialize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  secp256k1_hmac_sha256_write(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0x1124d6);
  secp256k1_hmac_sha256_finalize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *(undefined4 *)((long)in_RDI + 0x40) = 0;
  return;
}

Assistant:

static void secp256k1_rfc6979_hmac_sha256_initialize(secp256k1_rfc6979_hmac_sha256 *rng, const unsigned char *key, size_t keylen) {
    secp256k1_hmac_sha256 hmac;
    static const unsigned char zero[1] = {0x00};
    static const unsigned char one[1] = {0x01};

    memset(rng->v, 0x01, 32); /* RFC6979 3.2.b. */
    memset(rng->k, 0x00, 32); /* RFC6979 3.2.c. */

    /* RFC6979 3.2.d. */
    secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
    secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
    secp256k1_hmac_sha256_write(&hmac, zero, 1);
    secp256k1_hmac_sha256_write(&hmac, key, keylen);
    secp256k1_hmac_sha256_finalize(&hmac, rng->k);
    secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
    secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
    secp256k1_hmac_sha256_finalize(&hmac, rng->v);

    /* RFC6979 3.2.f. */
    secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
    secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
    secp256k1_hmac_sha256_write(&hmac, one, 1);
    secp256k1_hmac_sha256_write(&hmac, key, keylen);
    secp256k1_hmac_sha256_finalize(&hmac, rng->k);
    secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
    secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
    secp256k1_hmac_sha256_finalize(&hmac, rng->v);
    rng->retry = 0;
}